

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O2

void commit(uint8_t *digest,uint8_t *seed,uint8_t *aux,uint8_t *salt,size_t t,size_t j,
           picnic_instance_t *params)

{
  hash_context ctx;
  hash_context local_110;
  
  hash_init(&local_110,(ulong)params->digest_size);
  hash_update(&local_110,seed,(ulong)params->seed_size);
  if (aux != (uint8_t *)0x0) {
    hash_update(&local_110,aux,(ulong)params->view_size);
  }
  Keccak_HashUpdate(&local_110,salt,0x100);
  hash_update_uint16_le(&local_110,(uint16_t)t);
  hash_update_uint16_le(&local_110,(uint16_t)j);
  hash_final(&local_110);
  hash_squeeze(&local_110,digest,(ulong)params->digest_size);
  return;
}

Assistant:

static void commit(uint8_t* digest, const uint8_t* seed, const uint8_t* aux, const uint8_t* salt,
                   size_t t, size_t j, const picnic_instance_t* params) {
  /* Compute C[t][j];  as digest = H(seed||[aux]) aux is optional */
  hash_context ctx;

  hash_init(&ctx, params->digest_size);
  hash_update(&ctx, seed, params->seed_size);
  if (aux != NULL) {
    hash_update(&ctx, aux, params->view_size);
  }
  hash_update(&ctx, salt, SALT_SIZE);
  hash_update_uint16_le(&ctx, t);
  hash_update_uint16_le(&ctx, j);
  hash_final(&ctx);
  hash_squeeze(&ctx, digest, params->digest_size);
  hash_clear(&ctx);
}